

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openrpg.cpp
# Opt level: O0

int parse_args(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined8 uVar4;
  long lVar5;
  bool local_2ba;
  allocator local_289;
  string local_288 [32];
  undefined1 local_268 [8];
  ExpressionTree tree;
  allocator local_211;
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [37];
  byte local_14b;
  byte local_14a;
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [55];
  allocator local_c1;
  string local_c0 [32];
  NameGenerator local_a0 [8];
  NameGenerator name;
  int local_20;
  int local_1c;
  int opt_ind;
  int opt;
  char **argv_local;
  int argc_local;
  
  local_1c = 0;
  local_20 = 0;
  _opt_ind = argv;
  argv_local._4_4_ = argc;
  while (local_1c = ORPG::Core::getopt_long
                              (argv_local._4_4_,_opt_ind,"hn:qr:vV",parse_args::long_opts,&local_20)
        , local_1c != -1) {
    switch(local_1c) {
    case 0x3a:
    case 0x3f:
      ORPG::Core::PRINT_HELP_FLAG();
      break;
    default:
      fprintf(_stderr,"Aborting...\n");
      exit(1);
    case 0x56:
      ORPG::Core::PRINT_VERSION_FLAG();
      break;
    case 0x68:
      ORPG::Core::PRINT_HELP_FLAG();
      break;
    case 0x6e:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"dwarf",&local_c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"",&local_f9);
      ORPG::NameGenerator::NameGenerator(local_a0,local_c0,local_f8);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      pcVar1 = ORPG::Core::optarg;
      if (ORPG::Core::optind < argv_local._4_4_) {
        std::allocator<char>::allocator();
        local_14a = 0;
        local_14b = 0;
        std::__cxx11::string::string(local_120,pcVar1,&local_121);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_120,"male");
        pcVar1 = ORPG::Core::optarg;
        local_2ba = true;
        if (!bVar2) {
          std::allocator<char>::allocator();
          local_14a = 1;
          std::__cxx11::string::string(local_148,pcVar1,&local_149);
          local_14b = 1;
          local_2ba = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_148,"female");
        }
        if ((local_14b & 1) != 0) {
          std::__cxx11::string::~string(local_148);
        }
        if ((local_14a & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_149);
        }
        std::__cxx11::string::~string(local_120);
        std::allocator<char>::~allocator((allocator<char> *)&local_121);
        pcVar1 = ORPG::Core::optarg;
        if (local_2ba == false) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1c0,pcVar1,&local_1c1);
          ORPG::NameGenerator::set_race(local_a0,local_1c0);
          std::__cxx11::string::~string(local_1c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
          lVar5 = (long)ORPG::Core::optind;
          ORPG::Core::optind = ORPG::Core::optind + 1;
          pcVar1 = _opt_ind[lVar5];
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1e8,pcVar1,&local_1e9);
          ORPG::NameGenerator::set_gender(local_a0,local_1e8);
          std::__cxx11::string::~string(local_1e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_170,pcVar1,&local_171);
          ORPG::NameGenerator::set_gender(local_a0,local_170);
          std::__cxx11::string::~string(local_170);
          std::allocator<char>::~allocator((allocator<char> *)&local_171);
          lVar5 = (long)ORPG::Core::optind;
          ORPG::Core::optind = ORPG::Core::optind + 1;
          pcVar1 = _opt_ind[lVar5];
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_198,pcVar1,&local_199);
          ORPG::NameGenerator::set_race(local_a0,local_198);
          std::__cxx11::string::~string(local_198);
          std::allocator<char>::~allocator((allocator<char> *)&local_199);
        }
      }
      else if (ORPG::Core::optind == argv_local._4_4_) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_210,pcVar1,&local_211);
        ORPG::NameGenerator::set_race(local_a0,local_210);
        std::__cxx11::string::~string(local_210);
        std::allocator<char>::~allocator((allocator<char> *)&local_211);
      }
      else {
        fprintf(_stderr,"Error: invalid number of args (expects 1 or 2)\n");
        ORPG::Core::PRINT_HELP_FLAG();
      }
      ORPG::NameGenerator::make_name_abi_cxx11_();
      uVar4 = std::__cxx11::string::c_str();
      printf("%s\n",uVar4);
      std::__cxx11::string::~string((string *)&tree.field_0x28);
      exit(0);
    case 0x71:
      ORPG::Core::QUIET_FLAG._0_1_ = 1;
      ORPG::Core::VB_FLAG._0_1_ = 0;
      break;
    case 0x72:
      ORPG::ExpressionTree::ExpressionTree((ExpressionTree *)local_268);
      pcVar1 = ORPG::Core::optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_288,pcVar1,&local_289);
      ORPG::ExpressionTree::set_expression(local_268,local_288);
      std::__cxx11::string::~string(local_288);
      std::allocator<char>::~allocator((allocator<char> *)&local_289);
      uVar3 = ORPG::ExpressionTree::parse_expression((ExpressionTree *)local_268);
      printf("%i\n",(ulong)uVar3);
      exit(0);
    case 0x76:
      ORPG::Core::VB_FLAG._0_1_ = 1;
      ORPG::Core::QUIET_FLAG._0_1_ = 0;
    }
  }
  return -2;
}

Assistant:

int parse_args(int argc, char* argv[]) {
    /* getopt_long stores the option and option index here */
    int opt = 0, opt_ind = 0;

    /* these are the long cla's and their corresponding chars */
    static struct Core::option long_opts[] = {
        {"help",    no_argument,        0,  'h'},
        {"name",    required_argument,  0,  'n'},
        {"quiet",   no_argument,        0,  'q'},
        {"roll",    required_argument,  0,  'r'},
        {"verbose", no_argument,        0,  'v'},
        {"version", no_argument,        0,  'V'},
        /* NULL row to terminate struct */
        {0,         0,                  0,   0}
    };

    while ((opt = getopt_long(argc, argv, "hn:qr:vV", long_opts, &opt_ind))
			!= EOF) {
        switch (opt) {
			/* -h --help */
			case 'h': {
				Core::PRINT_HELP_FLAG();
			} break;

			/* -n --name */
			case 'n': {
				NameGenerator name;

				if(Core::optind < argc) {
					if((string)Core::optarg == "male" || (string)Core::optarg == "female") {
                        name.set_gender((string)Core::optarg);
						name.set_race((string)argv[Core::optind++]);
					} else {
						name.set_race((string)Core::optarg);
						name.set_gender((string)argv[Core::optind++]);
					}
				} else if(Core::optind == argc) {
					name.set_race((string)Core::optarg);
				} else {
					fprintf(stderr, "Error: invalid number of args (expects 1 or 2)\n");
					Core::PRINT_HELP_FLAG();
				}
				printf("%s\n", name.make_name().c_str());
				exit(EXIT_SUCCESS);
			} break;

			/* -q --quiet */
			case 'q': {
				Core::QUIET_FLAG = true;
				Core::VB_FLAG = false;
			} break;

			/* -r --roll */
			case 'r': {
				ExpressionTree tree;
				tree.set_expression(Core::optarg);
				printf("%i\n", tree.parse_expression());
				exit(EXIT_SUCCESS);
			} break;

			/* -v --verbose */
			case 'v': {
				Core::VB_FLAG = true;
				Core::QUIET_FLAG = false;
			} break;

			/* -V --version */
			case 'V': {
				Core::PRINT_VERSION_FLAG();
			} break;

			case ':':
			case '?': {
				Core::PRINT_HELP_FLAG();
			} break;

			/* if we get here something very bad happened */
			default: {
				fprintf(stderr, "Aborting...\n");
				exit(EXIT_FAILURE);
			}
        }
    }

    return CONTINUE_CODE;
}